

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O2

void __thiscall ArrayType::GenInitCode(ArrayType *this,Output *out_cc,Env *env)

{
  char *pcVar1;
  ID *id;
  
  Output::println(out_cc,"%s = nullptr;",(this->super_Type).lvalue_._M_dataplus._M_p);
  Type::GenInitCode(&this->super_Type,out_cc,env);
  if ((this->super_Type).incremental_parsing_ == true) {
    if (this->elem_it_var_field_ == (Field *)0x0) {
      id = (ID *)0x0;
    }
    else {
      id = this->elem_it_var_field_->id_;
    }
    pcVar1 = Env::LValue(env,id);
    Output::println(out_cc,"%s = -1;",pcVar1);
    return;
  }
  return;
}

Assistant:

void ArrayType::GenInitCode(Output* out_cc, Env* env)
	{
	// Do not initiate the array here
	// out_cc->println("%s = new %s;", lvalue(), vector_str_.c_str());
	out_cc->println("%s = nullptr;", lvalue());

	Type::GenInitCode(out_cc, env);
	if ( incremental_parsing() )
		{
		out_cc->println("%s = -1;", env->LValue(elem_it_var()));
		}
	}